

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode parse_hostname_login(Curl_URL *u,char *login,size_t len,uint flags,size_t *offset)

{
  void *pvVar1;
  Curl_handler **local_80;
  char *ptr;
  Curl_handler *h;
  char *optionsp;
  char *passwdp;
  char *userp;
  CURLcode ccode;
  CURLUcode result;
  size_t *offset_local;
  size_t sStack_28;
  uint flags_local;
  size_t len_local;
  char *login_local;
  Curl_URL *u_local;
  
  userp._4_4_ = CURLUE_OK;
  passwdp = (char *)0x0;
  optionsp = (char *)0x0;
  h = (Curl_handler *)0x0;
  ptr = (char *)0x0;
  *offset = 0;
  _ccode = offset;
  offset_local._4_4_ = flags;
  sStack_28 = len;
  len_local = (size_t)login;
  login_local = (char *)u;
  pvVar1 = memchr(login,0x40,len);
  if (pvVar1 != (void *)0x0) {
    if (*(long *)login_local != 0) {
      ptr = (char *)Curl_get_scheme_handler(*(char **)login_local);
    }
    if ((ptr == (char *)0x0) || ((*(uint *)(ptr + 0x8c) & 0x400) == 0)) {
      local_80 = (Curl_handler **)0x0;
    }
    else {
      local_80 = &h;
    }
    userp._0_4_ = Curl_parse_login_details
                            ((char *)len_local,(long)pvVar1 - len_local,&passwdp,&optionsp,
                             (char **)local_80);
    if ((CURLcode)userp == CURLE_OK) {
      if (passwdp != (char *)0x0) {
        if ((offset_local._4_4_ & 0x20) != 0) {
          userp._4_4_ = CURLUE_USER_NOT_ALLOWED;
          goto LAB_00a8eaa7;
        }
        (*Curl_cfree)(*(void **)(login_local + 8));
        *(char **)(login_local + 8) = passwdp;
      }
      if (optionsp != (char *)0x0) {
        (*Curl_cfree)(*(void **)(login_local + 0x10));
        *(char **)(login_local + 0x10) = optionsp;
      }
      if (h != (Curl_handler *)0x0) {
        (*Curl_cfree)(*(void **)(login_local + 0x18));
        *(Curl_handler **)(login_local + 0x18) = h;
      }
      *_ccode = (long)pvVar1 + (1 - len_local);
      return CURLUE_OK;
    }
    userp._4_4_ = CURLUE_BAD_LOGIN;
  }
LAB_00a8eaa7:
  (*Curl_cfree)(passwdp);
  (*Curl_cfree)(optionsp);
  (*Curl_cfree)(h);
  login_local[8] = '\0';
  login_local[9] = '\0';
  login_local[10] = '\0';
  login_local[0xb] = '\0';
  login_local[0xc] = '\0';
  login_local[0xd] = '\0';
  login_local[0xe] = '\0';
  login_local[0xf] = '\0';
  login_local[0x10] = '\0';
  login_local[0x11] = '\0';
  login_local[0x12] = '\0';
  login_local[0x13] = '\0';
  login_local[0x14] = '\0';
  login_local[0x15] = '\0';
  login_local[0x16] = '\0';
  login_local[0x17] = '\0';
  login_local[0x18] = '\0';
  login_local[0x19] = '\0';
  login_local[0x1a] = '\0';
  login_local[0x1b] = '\0';
  login_local[0x1c] = '\0';
  login_local[0x1d] = '\0';
  login_local[0x1e] = '\0';
  login_local[0x1f] = '\0';
  return userp._4_4_;
}

Assistant:

static CURLUcode parse_hostname_login(struct Curl_URL *u,
                                      const char *login,
                                      size_t len,
                                      unsigned int flags,
                                      size_t *offset) /* to the host name */
{
  CURLUcode result = CURLUE_OK;
  CURLcode ccode;
  char *userp = NULL;
  char *passwdp = NULL;
  char *optionsp = NULL;
  const struct Curl_handler *h = NULL;

  /* At this point, we assume all the other special cases have been taken
   * care of, so the host is at most
   *
   *   [user[:password][;options]]@]hostname
   *
   * We need somewhere to put the embedded details, so do that first.
   */
  char *ptr;

  DEBUGASSERT(login);

  *offset = 0;
  ptr = memchr(login, '@', len);
  if(!ptr)
    goto out;

  /* We will now try to extract the
   * possible login information in a string like:
   * ftp://user:password@ftp.my.site:8021/README */
  ptr++;

  /* if this is a known scheme, get some details */
  if(u->scheme)
    h = Curl_get_scheme_handler(u->scheme);

  /* We could use the login information in the URL so extract it. Only parse
     options if the handler says we should. Note that 'h' might be NULL! */
  ccode = Curl_parse_login_details(login, ptr - login - 1,
                                   &userp, &passwdp,
                                   (h && (h->flags & PROTOPT_URLOPTIONS)) ?
                                   &optionsp:NULL);
  if(ccode) {
    result = CURLUE_BAD_LOGIN;
    goto out;
  }

  if(userp) {
    if(flags & CURLU_DISALLOW_USER) {
      /* Option DISALLOW_USER is set and url contains username. */
      result = CURLUE_USER_NOT_ALLOWED;
      goto out;
    }
    free(u->user);
    u->user = userp;
  }

  if(passwdp) {
    free(u->password);
    u->password = passwdp;
  }

  if(optionsp) {
    free(u->options);
    u->options = optionsp;
  }

  /* the host name starts at this offset */
  *offset = ptr - login;
  return CURLUE_OK;

out:

  free(userp);
  free(passwdp);
  free(optionsp);
  u->user = NULL;
  u->password = NULL;
  u->options = NULL;

  return result;
}